

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetJacFnBS(void *cvode_mem,int which,CVLsJacFnBS jacBS)

{
  CVLsMemB *in_RDX;
  int retval;
  void *cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = cvLs_AccessLMemB(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                             in_stack_ffffffffffffffb8,
                             (CVodeMem *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (CVadjMem *)&stack0xffffffffffffffc0,(CVodeBMem *)0x13df9f,in_RDX);
  if (local_4 == 0) {
    *(CVLsMemB **)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 8) = in_RDX;
    if (in_RDX == (CVLsMemB *)0x0) {
      local_4 = CVodeSetJacFn(in_stack_ffffffffffffffc8,
                              (CVLsJacFn)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    else {
      local_4 = CVodeSetJacFn(in_stack_ffffffffffffffc8,
                              (CVLsJacFn)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  return local_4;
}

Assistant:

int CVodeSetJacFnBS(void* cvode_mem, int which, CVLsJacFnBS jacBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  void* cvodeB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* set jacBS function pointer */
  cvlsB_mem->jacBS = jacBS;

  /* call corresponding routine for cvodeB_mem structure */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  if (jacBS != NULL) { retval = CVodeSetJacFn(cvodeB_mem, cvLsJacBSWrapper); }
  else { retval = CVodeSetJacFn(cvodeB_mem, NULL); }

  return (retval);
}